

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O3

void dirENT(void)

{
  char *message;
  
  if (PseudoORG == DISP_NONE) {
    message = "ENT should be after DISP";
  }
  else if (Relocation::type == 0 || PseudoORG != DISP_ACTIVE) {
    if (PseudoORG != DISP_INSIDE_RELOCATE || Relocation::type != 0) {
      CurAddress = adrdisp;
      PseudoORG = DISP_NONE;
      dispPageNum = -1;
      return;
    }
    message = "The DISP block did start inside of relocation block, can\'t end outside of it";
  }
  else {
    message = "The DISP block did start outside of relocation block, can\'t end inside it";
  }
  Error(message,(char *)0x0,PASS3);
  return;
}

Assistant:

static void dirENT() {
	if (DISP_NONE == PseudoORG) {
		Error("ENT should be after DISP");
		return;
	}
	// check if the DISP..ENT block is either fully inside relocation block, or engulfing it fully.
	if (DISP_ACTIVE == PseudoORG && Relocation::type) {
		Error("The DISP block did start outside of relocation block, can't end inside it");
		return;
	}
	if (DISP_INSIDE_RELOCATE == PseudoORG && !Relocation::type) {
		Error("The DISP block did start inside of relocation block, can't end outside of it");
		return;
	}
	CurAddress = adrdisp;
	PseudoORG = DISP_NONE;
	dispPageNum = LABEL_PAGE_UNDEFINED;
}